

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_singleCallNotMadeIsNotFulfilledButCanMatchActualCalls_Test::testBody
          (TEST_MockExpectedCall_singleCallNotMadeIsNotFulfilledButCanMatchActualCalls_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_c0;
  MockCheckedExpectedCall expectedCall;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall(&expectedCall,1);
  SimpleString::SimpleString(&local_c0,"name");
  MockCheckedExpectedCall::withName(&expectedCall,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::isFulfilled(&expectedCall);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!expectedCall.isFulfilled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1cd,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::canMatchActualCalls(&expectedCall);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","expectedCall.canMatchActualCalls()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1ce,pTVar3);
  MockCheckedExpectedCall::~MockCheckedExpectedCall(&expectedCall);
  return;
}

Assistant:

TEST(MockExpectedCall, singleCallNotMadeIsNotFulfilledButCanMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    CHECK(!expectedCall.isFulfilled());
    CHECK(expectedCall.canMatchActualCalls());
}